

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O0

void __thiscall Am_Web_Data::Clear_Invalid(Am_Web_Data *this)

{
  Input_Port *pIVar1;
  Input_Port *next;
  Input_Port *curr;
  Am_Web_Data *this_local;
  
  pIVar1 = this->invalid_list;
  while (next = pIVar1, next != (Input_Port *)0x0) {
    next->invalid = false;
    pIVar1 = next->next_invalid;
    next->next_invalid = (Input_Port *)0x0;
    if ((next->changed & 1U) == 0) {
      Am_Slot::Validate(&next->context);
    }
  }
  this->invalid_list = (Input_Port *)0x0;
  return;
}

Assistant:

void
Am_Web_Data::Clear_Invalid()
{
  Input_Port *curr = invalid_list;
  Input_Port *next;
  while (curr) {
    curr->invalid = false;
    next = curr->next_invalid;
    curr->next_invalid = nullptr;
    if (!curr->changed)
      curr->context.Validate();
    curr = next;
  }
  invalid_list = nullptr;
}